

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest::teardown
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest *this)

{
  bool bVar1;
  TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest *this_local;
  
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  bVar1 = DummyMemoryLeakDetector::wasDeleted();
  if ((!bVar1) && (this->dummyDetector != (DummyMemoryLeakDetector *)0x0)) {
    (*(this->dummyDetector->super_MemoryLeakDetector)._vptr_MemoryLeakDetector[1])();
  }
  bVar1 = DummyMemoryLeakFailure::wasDeleted();
  if ((!bVar1) && (this->dummyReporter != (MemoryLeakFailure *)0x0)) {
    (*this->dummyReporter->_vptr_MemoryLeakFailure[1])();
  }
  MemoryLeakWarningPlugin::setGlobalDetector(this->detector,this->failureReporter);
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  UtestShell::resetCrashMethod();
  GlobalMemoryAllocatorStash::restore(&this->memoryAllocatorStash);
  return;
}

Assistant:

void teardown() _override
    {
        MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

        MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

        if (!DummyMemoryLeakDetector::wasDeleted()) delete dummyDetector;
        if (!DummyMemoryLeakFailure::wasDeleted()) delete dummyReporter;
        MemoryLeakWarningPlugin::setGlobalDetector(detector, failureReporter);

        MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

        UtestShell::resetCrashMethod();

        memoryAllocatorStash.restore();
    }